

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int y4m_input_open(y4m_input *y4m_ctx,FILE *file,char *skip_buffer,int num_skip,
                  aom_chroma_sample_position_t csp,int only_420)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  long lVar3;
  void *in_RDX;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  char tag_buffer [9];
  FILE *in_stack_000000a0;
  y4m_input *in_stack_000000a8;
  char local_35 [9];
  int local_2c;
  int local_28;
  int *local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_10 = in_RDI;
  if (0 < in_ECX) {
    memcpy(local_35,in_RDX,(long)in_ECX);
  }
  iVar1 = file_read(in_stack_00000008,unaff_retaddr,
                    (FILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = memcmp("YUV4MPEG2",local_35,9);
    if (iVar1 == 0) {
      iVar1 = file_read(in_stack_00000008,unaff_retaddr,
                        (FILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if ((iVar1 == 0) || (local_35[0] != ' ')) {
        fprintf(_stderr,"Error parsing header: space must follow %s\n","YUV4MPEG2");
        iVar1 = -1;
      }
      else {
        iVar1 = parse_tags(in_stack_000000a8,in_stack_000000a0);
        if (iVar1 == 0) {
          fprintf(_stderr,"Error parsing %s header.\n","YUV4MPEG2");
          iVar1 = -1;
        }
        else {
          if ((char)local_10[6] == '?') {
            fprintf(_stderr,
                    "Warning: Input video interlacing format unknown; assuming progressive scan.\n")
            ;
          }
          else if ((char)local_10[6] != 'p') {
            fprintf(_stderr,"Input video is interlaced; Only progressive scan handled.\n");
            return -1;
          }
          if ((local_28 == 1) && (iVar1 = strcmp((char *)(local_10 + 0xb),"420mpeg2"), iVar1 != 0))
          {
            fprintf(_stderr,"Vertical chroma sample position only supported for 420mpeg2 input\n");
            iVar1 = -1;
          }
          else {
            if (local_28 == 2) {
              fprintf(_stderr,"Ignoring colocated chroma sample position for reading in Y4M\n");
            }
            local_10[0x1e] = 0x102;
            local_10[0x1f] = 0xc;
            local_10[0x20] = 8;
            local_10[0x1c] = 0;
            local_10[0x1d] = 0;
            local_10[0x1a] = 0;
            local_10[0x1b] = 0;
            iVar1 = strcmp((char *)(local_10 + 0xb),"420");
            if (((iVar1 == 0) || (iVar1 = strcmp((char *)(local_10 + 0xb),"420jpeg"), iVar1 == 0))
               || (iVar1 = strcmp((char *)(local_10 + 0xb),"420mpeg2"), iVar1 == 0)) {
              local_10[10] = 2;
              local_10[8] = 2;
              local_10[9] = 2;
              local_10[7] = 2;
              *(long *)(local_10 + 0x12) =
                   (long)(*local_10 * local_10[1] +
                         ((*local_10 + 1) / 2) * 2 * ((local_10[1] + 1) / 2));
              local_10[0x16] = 0;
              local_10[0x17] = 0;
              local_10[0x14] = 0;
              local_10[0x15] = 0;
              *(code **)(local_10 + 0x18) = y4m_convert_null;
            }
            else {
              iVar1 = strcmp((char *)(local_10 + 0xb),"420p10");
              if (iVar1 == 0) {
                local_10[7] = 2;
                local_10[9] = 2;
                local_10[8] = 2;
                local_10[10] = 2;
                *(long *)(local_10 + 0x12) =
                     (long)((*local_10 * local_10[1] +
                            ((*local_10 + 1) / 2) * 2 * ((local_10[1] + 1) / 2)) * 2);
                local_10[0x16] = 0;
                local_10[0x17] = 0;
                local_10[0x14] = 0;
                local_10[0x15] = 0;
                *(code **)(local_10 + 0x18) = y4m_convert_null;
                local_10[0x20] = 10;
                local_10[0x1f] = 0xf;
                local_10[0x1e] = 0x902;
                if (local_2c != 0) {
                  fprintf(_stderr,"Unsupported conversion from 420p10 to 420jpeg\n");
                  return -1;
                }
              }
              else {
                iVar1 = strcmp((char *)(local_10 + 0xb),"420p12");
                if (iVar1 == 0) {
                  local_10[7] = 2;
                  local_10[9] = 2;
                  local_10[8] = 2;
                  local_10[10] = 2;
                  *(long *)(local_10 + 0x12) =
                       (long)((*local_10 * local_10[1] +
                              ((*local_10 + 1) / 2) * 2 * ((local_10[1] + 1) / 2)) * 2);
                  local_10[0x16] = 0;
                  local_10[0x17] = 0;
                  local_10[0x14] = 0;
                  local_10[0x15] = 0;
                  *(code **)(local_10 + 0x18) = y4m_convert_null;
                  local_10[0x20] = 0xc;
                  local_10[0x1f] = 0x12;
                  local_10[0x1e] = 0x902;
                  if (local_2c != 0) {
                    fprintf(_stderr,"Unsupported conversion from 420p12 to 420jpeg\n");
                    return -1;
                  }
                }
                else {
                  iVar1 = strcmp((char *)(local_10 + 0xb),"420paldv");
                  if (iVar1 == 0) {
                    local_10[10] = 2;
                    local_10[8] = 2;
                    local_10[9] = 2;
                    local_10[7] = 2;
                    *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                    *(long *)(local_10 + 0x14) =
                         (long)(((*local_10 + 1) / 2) * 3 * ((local_10[1] + 1) / 2));
                    *(long *)(local_10 + 0x16) =
                         (long)(((*local_10 + 1) / 2) * 2 * ((local_10[1] + 1) / 2));
                    *(code **)(local_10 + 0x18) = y4m_convert_42xpaldv_42xjpeg;
                  }
                  else {
                    iVar1 = strcmp((char *)(local_10 + 0xb),"422jpeg");
                    if (iVar1 == 0) {
                      local_10[9] = 2;
                      local_10[7] = 2;
                      local_10[8] = 1;
                      local_10[10] = 2;
                      *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                      lVar3 = (long)(((*local_10 + 1) / 2) * 2 * local_10[1]);
                      *(long *)(local_10 + 0x16) = lVar3;
                      *(long *)(local_10 + 0x14) = lVar3;
                      *(code **)(local_10 + 0x18) = y4m_convert_422jpeg_420jpeg;
                    }
                    else {
                      iVar1 = strcmp((char *)(local_10 + 0xb),"422");
                      if (iVar1 == 0) {
                        local_10[7] = 2;
                        local_10[8] = 1;
                        if (local_2c == 0) {
                          local_10[0x1e] = 0x105;
                          local_10[0x1f] = 0x10;
                          local_10[9] = local_10[7];
                          local_10[10] = local_10[8];
                          *(long *)(local_10 + 0x12) =
                               (long)(*local_10 * local_10[1] +
                                     ((*local_10 + 1) / 2) * 2 * local_10[1]);
                          local_10[0x16] = 0;
                          local_10[0x17] = 0;
                          local_10[0x14] = 0;
                          local_10[0x15] = 0;
                          *(code **)(local_10 + 0x18) = y4m_convert_null;
                        }
                        else {
                          local_10[9] = 2;
                          local_10[10] = 2;
                          *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                          *(long *)(local_10 + 0x16) =
                               (long)(((*local_10 + 1) / 2) * 2 * local_10[1]);
                          *(long *)(local_10 + 0x14) =
                               *(long *)(local_10 + 0x16) +
                               (long)(((*local_10 + 1) / 2) * local_10[1]);
                          *(code **)(local_10 + 0x18) = y4m_convert_422_420jpeg;
                        }
                      }
                      else {
                        iVar1 = strcmp((char *)(local_10 + 0xb),"422p10");
                        if (iVar1 == 0) {
                          local_10[7] = 2;
                          local_10[8] = 1;
                          local_10[0x1e] = 0x905;
                          local_10[0x1f] = 0x14;
                          local_10[0x20] = 10;
                          local_10[9] = local_10[7];
                          local_10[10] = local_10[8];
                          *(long *)(local_10 + 0x12) =
                               (long)((*local_10 * local_10[1] +
                                      ((*local_10 + 1) / 2) * 2 * local_10[1]) * 2);
                          local_10[0x16] = 0;
                          local_10[0x17] = 0;
                          local_10[0x14] = 0;
                          local_10[0x15] = 0;
                          *(code **)(local_10 + 0x18) = y4m_convert_null;
                          if (local_2c != 0) {
                            fprintf(_stderr,"Unsupported conversion from 422p10 to 420jpeg\n");
                            return -1;
                          }
                        }
                        else {
                          iVar1 = strcmp((char *)(local_10 + 0xb),"422p12");
                          if (iVar1 == 0) {
                            local_10[7] = 2;
                            local_10[8] = 1;
                            local_10[0x1e] = 0x905;
                            local_10[0x1f] = 0x18;
                            local_10[0x20] = 0xc;
                            local_10[9] = local_10[7];
                            local_10[10] = local_10[8];
                            *(long *)(local_10 + 0x12) =
                                 (long)((*local_10 * local_10[1] +
                                        ((*local_10 + 1) / 2) * 2 * local_10[1]) * 2);
                            local_10[0x16] = 0;
                            local_10[0x17] = 0;
                            local_10[0x14] = 0;
                            local_10[0x15] = 0;
                            *(code **)(local_10 + 0x18) = y4m_convert_null;
                            if (local_2c != 0) {
                              fprintf(_stderr,"Unsupported conversion from 422p12 to 420jpeg\n");
                              return -1;
                            }
                          }
                          else {
                            iVar1 = strcmp((char *)(local_10 + 0xb),"411");
                            if (iVar1 == 0) {
                              local_10[7] = 4;
                              local_10[9] = 2;
                              local_10[8] = 1;
                              local_10[10] = 2;
                              *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                              *(long *)(local_10 + 0x16) =
                                   (long)(((*local_10 + 3) / 4) * 2 * local_10[1]);
                              *(long *)(local_10 + 0x14) =
                                   *(long *)(local_10 + 0x16) +
                                   (long)(((*local_10 + 1) / 2) * local_10[1]);
                              *(code **)(local_10 + 0x18) = y4m_convert_411_420jpeg;
                            }
                            else {
                              iVar1 = strcmp((char *)(local_10 + 0xb),"444");
                              if (iVar1 == 0) {
                                local_10[7] = 1;
                                local_10[8] = 1;
                                if (local_2c == 0) {
                                  local_10[0x1e] = 0x106;
                                  local_10[0x1f] = 0x18;
                                  local_10[9] = local_10[7];
                                  local_10[10] = local_10[8];
                                  *(long *)(local_10 + 0x12) = (long)(*local_10 * 3 * local_10[1]);
                                  local_10[0x16] = 0;
                                  local_10[0x17] = 0;
                                  local_10[0x14] = 0;
                                  local_10[0x15] = 0;
                                  *(code **)(local_10 + 0x18) = y4m_convert_null;
                                }
                                else {
                                  local_10[9] = 2;
                                  local_10[10] = 2;
                                  *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                                  *(long *)(local_10 + 0x16) = (long)(*local_10 * 2 * local_10[1]);
                                  *(long *)(local_10 + 0x14) =
                                       *(long *)(local_10 + 0x16) +
                                       (long)(((*local_10 + 1) / 2) * local_10[1]);
                                  *(code **)(local_10 + 0x18) = y4m_convert_444_420jpeg;
                                }
                              }
                              else {
                                iVar1 = strcmp((char *)(local_10 + 0xb),"444p10");
                                if (iVar1 == 0) {
                                  local_10[7] = 1;
                                  local_10[8] = 1;
                                  local_10[0x1e] = 0x906;
                                  local_10[0x1f] = 0x1e;
                                  local_10[0x20] = 10;
                                  local_10[9] = local_10[7];
                                  local_10[10] = local_10[8];
                                  *(long *)(local_10 + 0x12) = (long)(*local_10 * 6 * local_10[1]);
                                  local_10[0x16] = 0;
                                  local_10[0x17] = 0;
                                  local_10[0x14] = 0;
                                  local_10[0x15] = 0;
                                  *(code **)(local_10 + 0x18) = y4m_convert_null;
                                  if (local_2c != 0) {
                                    fprintf(_stderr,
                                            "Unsupported conversion from 444p10 to 420jpeg\n");
                                    return -1;
                                  }
                                }
                                else {
                                  iVar1 = strcmp((char *)(local_10 + 0xb),"444p12");
                                  if (iVar1 == 0) {
                                    local_10[7] = 1;
                                    local_10[8] = 1;
                                    local_10[0x1e] = 0x906;
                                    local_10[0x1f] = 0x24;
                                    local_10[0x20] = 0xc;
                                    local_10[9] = local_10[7];
                                    local_10[10] = local_10[8];
                                    *(long *)(local_10 + 0x12) = (long)(*local_10 * 6 * local_10[1])
                                    ;
                                    local_10[0x16] = 0;
                                    local_10[0x17] = 0;
                                    local_10[0x14] = 0;
                                    local_10[0x15] = 0;
                                    *(code **)(local_10 + 0x18) = y4m_convert_null;
                                    if (local_2c != 0) {
                                      fprintf(_stderr,
                                              "Unsupported conversion from 444p12 to 420jpeg\n");
                                      return -1;
                                    }
                                  }
                                  else {
                                    iVar1 = strcmp((char *)(local_10 + 0xb),"444alpha");
                                    if (iVar1 == 0) {
                                      local_10[7] = 1;
                                      local_10[8] = 1;
                                      if (local_2c == 0) {
                                        fprintf(_stderr,"Unsupported format: 444A\n");
                                        return -1;
                                      }
                                      local_10[9] = 2;
                                      local_10[10] = 2;
                                      *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                                      lVar3 = (long)(*local_10 * 3 * local_10[1]);
                                      *(long *)(local_10 + 0x16) = lVar3;
                                      *(long *)(local_10 + 0x14) = lVar3;
                                      *(code **)(local_10 + 0x18) = y4m_convert_444_420jpeg;
                                    }
                                    else {
                                      iVar1 = strcmp((char *)(local_10 + 0xb),"mono");
                                      if (iVar1 != 0) {
                                        fprintf(_stderr,"Unknown chroma sampling type: %s\n",
                                                local_10 + 0xb);
                                        return -1;
                                      }
                                      local_10[8] = 0;
                                      local_10[7] = 0;
                                      local_10[10] = 2;
                                      local_10[9] = 2;
                                      *(long *)(local_10 + 0x12) = (long)(*local_10 * local_10[1]);
                                      local_10[0x16] = 0;
                                      local_10[0x17] = 0;
                                      local_10[0x14] = 0;
                                      local_10[0x15] = 0;
                                      *(code **)(local_10 + 0x18) = y4m_convert_mono_420jpeg;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            *(long *)(local_10 + 0x10) =
                 (long)(*local_10 * local_10[1] +
                       ((*local_10 + local_10[9] + -1) / local_10[9]) * 2 *
                       ((local_10[1] + local_10[10] + -1) / local_10[10]));
            if (local_10[0x20] == 8) {
              pvVar2 = malloc(*(size_t *)(local_10 + 0x10));
              *(void **)(local_10 + 0x1a) = pvVar2;
            }
            else {
              pvVar2 = malloc(*(long *)(local_10 + 0x10) << 1);
              *(void **)(local_10 + 0x1a) = pvVar2;
            }
            if (*(long *)(local_10 + 0x1a) == 0) {
              iVar1 = -1;
            }
            else {
              if (*(long *)(local_10 + 0x14) != 0) {
                pvVar2 = malloc(*(size_t *)(local_10 + 0x14));
                *(void **)(local_10 + 0x1c) = pvVar2;
                if (*(long *)(local_10 + 0x1c) == 0) {
                  free(*(void **)(local_10 + 0x1a));
                  return -1;
                }
              }
              iVar1 = 0;
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"Error parsing header: must start with %s\n","YUV4MPEG2");
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int y4m_input_open(y4m_input *y4m_ctx, FILE *file, char *skip_buffer,
                   int num_skip, aom_chroma_sample_position_t csp,
                   int only_420) {
  // File must start with |TAG|.
  char tag_buffer[9];  // 9 == strlen(TAG)
  // Read as much as possible from |skip_buffer|, which were characters
  // that were previously read from the file to do input-type detection.
  assert(num_skip >= 0 && num_skip <= 8);
  if (num_skip > 0) {
    memcpy(tag_buffer, skip_buffer, num_skip);
  }
  // Start reading from the file now that the |skip_buffer| is depleted.
  if (!file_read(tag_buffer + num_skip, 9 - num_skip, file)) {
    return -1;
  }
  if (memcmp(TAG, tag_buffer, 9) != 0) {
    fprintf(stderr, "Error parsing header: must start with %s\n", TAG);
    return -1;
  }
  // Next character must be a space.
  if (!file_read(tag_buffer, 1, file) || tag_buffer[0] != ' ') {
    fprintf(stderr, "Error parsing header: space must follow %s\n", TAG);
    return -1;
  }
  if (!parse_tags(y4m_ctx, file)) {
    fprintf(stderr, "Error parsing %s header.\n", TAG);
    return -1;
  }
  if (y4m_ctx->interlace == '?') {
    fprintf(stderr,
            "Warning: Input video interlacing format unknown; "
            "assuming progressive scan.\n");
  } else if (y4m_ctx->interlace != 'p') {
    fprintf(stderr,
            "Input video is interlaced; "
            "Only progressive scan handled.\n");
    return -1;
  }
  /* Only support vertical chroma sample position if the input format is
   * already 420mpeg2. Colocated is not supported in Y4M.
   */
  if (csp == AOM_CSP_VERTICAL &&
      strcmp(y4m_ctx->chroma_type, "420mpeg2") != 0) {
    fprintf(stderr,
            "Vertical chroma sample position only supported "
            "for 420mpeg2 input\n");
    return -1;
  }
  if (csp == AOM_CSP_COLOCATED) {
    // TODO(any): check the right way to handle this in y4m
    fprintf(stderr,
            "Ignoring colocated chroma sample position for reading in Y4M\n");
  }
  y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
  y4m_ctx->bps = 12;
  y4m_ctx->bit_depth = 8;
  y4m_ctx->aux_buf = NULL;
  y4m_ctx->dst_buf = NULL;
  if (strcmp(y4m_ctx->chroma_type, "420") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420jpeg") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420mpeg2") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        y4m_ctx->pic_w * y4m_ctx->pic_h +
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
  } else if (strcmp(y4m_ctx->chroma_type, "420p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->bps = 15;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->bps = 18;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420paldv") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_sz =
        3 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->convert = y4m_convert_42xpaldv_42xjpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422jpeg") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_422jpeg_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz =
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_422_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
      y4m_ctx->bps = 16;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz =
          y4m_ctx->pic_w * y4m_ctx->pic_h +
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 20;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 24;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "411") == 0) {
    y4m_ctx->src_c_dec_h = 4;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_read_sz = 2 * ((y4m_ctx->pic_w + 3) / 4) * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz =
        y4m_ctx->aux_buf_read_sz + ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_411_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "444") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz = 2 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
      y4m_ctx->bps = 24;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz = 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p10") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 30;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p12") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 36;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444alpha") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.
        The extra plane also gets read into the aux buf.
        It will be discarded.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
          3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      fprintf(stderr, "Unsupported format: 444A\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "mono") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->src_c_dec_v = 0;
    y4m_ctx->dst_c_dec_h = y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*No extra space required, but we need to clear the chroma planes.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_mono_420jpeg;
  } else {
    fprintf(stderr, "Unknown chroma sampling type: %s\n", y4m_ctx->chroma_type);
    return -1;
  }
  /*The size of the final frame buffers is always computed from the
     destination chroma decimation type.*/
  y4m_ctx->dst_buf_sz =
      y4m_ctx->pic_w * y4m_ctx->pic_h +
      2 * ((y4m_ctx->pic_w + y4m_ctx->dst_c_dec_h - 1) / y4m_ctx->dst_c_dec_h) *
          ((y4m_ctx->pic_h + y4m_ctx->dst_c_dec_v - 1) / y4m_ctx->dst_c_dec_v);
  if (y4m_ctx->bit_depth == 8)
    y4m_ctx->dst_buf = (unsigned char *)malloc(y4m_ctx->dst_buf_sz);
  else
    y4m_ctx->dst_buf = (unsigned char *)malloc(2 * y4m_ctx->dst_buf_sz);
  if (!y4m_ctx->dst_buf) return -1;

  if (y4m_ctx->aux_buf_sz > 0) {
    y4m_ctx->aux_buf = (unsigned char *)malloc(y4m_ctx->aux_buf_sz);
    if (!y4m_ctx->aux_buf) {
      free(y4m_ctx->dst_buf);
      return -1;
    }
  }
  return 0;
}